

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TlsReceiverTest::TlsReceiverTest(TlsReceiverTest *this)

{
  AsyncIoProvider *pAVar1;
  Disposer *pDVar2;
  ConnectionReceiver *pCVar3;
  undefined8 uVar4;
  long *plVar5;
  Own<kj::ConnectionReceiver,_std::nullptr_t> OVar6;
  undefined1 local_140 [24];
  undefined1 local_128 [120];
  char local_b0;
  undefined8 *local_a8;
  long *local_a0;
  Options local_98;
  
  TlsTest::defaultClient();
  TlsTest::defaultServer();
  TlsTest::TlsTest(&this->super_TlsTest,&local_98,(Options *)(local_128 + 8));
  plVar5 = local_a0;
  if ((local_b0 == '\x01') && (local_a0 != (long *)0x0)) {
    local_a0 = (long *)0x0;
    (**(code **)*local_a8)(local_a8,*(long *)(*plVar5 + -0x10) + (long)plVar5);
  }
  uVar4 = local_98.acceptErrorHandler.ptr.field_1.value.impl.ptr;
  if ((local_98.acceptErrorHandler.ptr.isSet == true) &&
     (local_98.acceptErrorHandler.ptr.field_1.value.impl.ptr != (Iface *)0x0)) {
    local_98.acceptErrorHandler.ptr.field_1.value.impl.ptr = (Iface *)0x0;
    (**(local_98.acceptErrorHandler.ptr.field_1.value.impl.disposer)->_vptr_Disposer)
              (local_98.acceptErrorHandler.ptr.field_1.value.impl.disposer,
               ((Iface *)uVar4)->_vptr_Iface[-2] + (long)&((Iface *)uVar4)->_vptr_Iface);
  }
  (this->receiver).disposer = (Disposer *)0x0;
  (this->receiver).ptr = (ConnectionReceiver *)0x0;
  pAVar1 = (this->super_TlsTest).io.provider.ptr;
  local_128._0_8_ = operator_new(0x40);
  (((MockConnectionReceiver *)local_128._0_8_)->super_ConnectionReceiver)._vptr_ConnectionReceiver =
       (_func_int **)&PTR_accept_0063d978;
  ((MockConnectionReceiver *)local_128._0_8_)->provider = pAVar1;
  (((MockConnectionReceiver *)local_128._0_8_)->serverFulfiller).disposer = (Disposer *)0x0;
  (((MockConnectionReceiver *)local_128._0_8_)->serverFulfiller).ptr = (PromiseFulfiller<void> *)0x0
  ;
  (((MockConnectionReceiver *)local_128._0_8_)->clientRequests).builder.ptr = (ClientRequest *)0x0;
  (((MockConnectionReceiver *)local_128._0_8_)->clientRequests).builder.pos =
       (RemoveConst<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *)0x0;
  (((MockConnectionReceiver *)local_128._0_8_)->clientRequests).builder.endPtr =
       (ClientRequest *)0x0;
  (((MockConnectionReceiver *)local_128._0_8_)->clientRequests).builder.disposer =
       (ArrayDisposer *)&NullArrayDisposer::instance;
  this->baseReceiver = (MockConnectionReceiver *)local_128._0_8_;
  local_140._16_8_ =
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver>::instance;
  OVar6 = TlsContext::wrapPort
                    ((TlsContext *)local_140,
                     (Own<kj::ConnectionReceiver,_std::nullptr_t> *)&(this->super_TlsTest).tlsServer
                    );
  pDVar2 = (this->receiver).disposer;
  pCVar3 = (this->receiver).ptr;
  (this->receiver).disposer = (Disposer *)local_140._0_8_;
  (this->receiver).ptr = (ConnectionReceiver *)local_140._8_8_;
  local_140._8_8_ = (long *)0x0;
  if (pCVar3 != (ConnectionReceiver *)0x0) {
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pCVar3->_vptr_ConnectionReceiver[-2] + (long)&pCVar3->_vptr_ConnectionReceiver
               ,OVar6.ptr);
  }
  uVar4 = local_140._8_8_;
  if ((long *)local_140._8_8_ != (long *)0x0) {
    local_140._8_8_ = (long *)0x0;
    (***(_func_int ***)local_140._0_8_)(local_140._0_8_,uVar4 + *(long *)(*(long *)uVar4 + -0x10));
  }
  uVar4 = local_128._0_8_;
  if ((MockConnectionReceiver *)local_128._0_8_ != (MockConnectionReceiver *)0x0) {
    local_128._0_8_ = 0;
    (**((MonotonicClock *)local_140._16_8_)->_vptr_MonotonicClock)
              (local_140._16_8_,
               ((ConnectionReceiver *)uVar4)->_vptr_ConnectionReceiver[-2] +
               (long)&((ConnectionReceiver *)uVar4)->_vptr_ConnectionReceiver);
  }
  return;
}

Assistant:

TlsReceiverTest(): TlsTest() {
    auto baseReceiverPtr = kj::heap<MockConnectionReceiver>(*io.provider);
    baseReceiver = baseReceiverPtr.get();
    receiver = tlsServer.wrapPort(kj::mv(baseReceiverPtr));
  }